

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector_manyvector.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  int iVar51;
  int iVar52;
  int iVar53;
  long lVar54;
  long lVar55;
  long lVar56;
  N_Vector X;
  undefined8 uVar57;
  N_Vector Y;
  N_Vector Z;
  N_Vector X_00;
  N_Vector p_Var58;
  uint uVar59;
  N_Vector Xsub [2];
  long local_48;
  long local_40;
  N_Vector local_38;
  
  Test_Init(0);
  if (argc < 4) {
    puts("ERROR: THREE (3) Inputs required: subvector 1 length, subvector 2 length, print timing ");
    Test_Abort(1);
  }
  lVar54 = atol(argv[1]);
  if (lVar54 < 1) {
    puts("ERROR: length of subvector 1 must be a positive integer ");
    Test_Abort(1);
  }
  lVar55 = atol(argv[2]);
  if (lVar55 < 1) {
    puts("ERROR: length of subvector 2 must be a positive integer ");
    Test_Abort(1);
  }
  iVar1 = atoi(argv[3]);
  SetTiming(iVar1,0);
  puts("Testing ManyVector (serial) N_Vector ");
  printf("Vector lengths: %ld %ld \n",lVar54,lVar55);
  lVar56 = N_VNew_Serial(lVar54,sunctx);
  local_48 = lVar56;
  if (lVar56 == 0) {
    puts("FAIL: Unable to create a new serial subvector \n");
    Test_Abort(1);
  }
  local_40 = N_VNew_Serial(lVar55,sunctx);
  if (local_40 == 0) {
    N_VDestroy(lVar56);
    puts("FAIL: Unable to create a new serial subvector \n");
    Test_Abort(1);
  }
  X = (N_Vector)N_VNew_ManyVector(2,&local_48,sunctx);
  iVar1 = Test_N_VGetVectorID(X,SUNDIALS_NVEC_MANYVECTOR,0);
  iVar2 = Test_N_VGetLength(X,0);
  iVar3 = Test_N_VGetCommunicator(X,0,0);
  iVar3 = iVar3 + iVar2 + iVar1;
  lVar56 = N_VGetNumSubvectors_ManyVector(X);
  if (lVar56 != 2) {
    puts(">>> FAILED test -- N_VGetNumSubvectors_ManyVector");
    iVar3 = iVar3 + 1;
  }
  uVar57 = N_VGetSubvector_ManyVector(X,0);
  lVar56 = N_VGetLength(uVar57);
  if (lVar56 != lVar54) {
    puts(">>> FAILED test -- N_VGetSubvector_ManyVector");
    iVar3 = iVar3 + 1;
  }
  uVar57 = N_VGetSubvector_ManyVector(X,1);
  lVar56 = N_VGetLength(uVar57);
  if (lVar56 != lVar55) {
    puts(">>> FAILED test -- N_VGetSubvector_ManyVector");
    iVar3 = iVar3 + 1;
  }
  lVar56 = N_VClone(X);
  if (lVar56 == 0) {
    N_VDestroy(X);
    puts("FAIL: Unable to create a new vector\n");
    Test_Abort(1);
  }
  Y = (N_Vector)N_VClone(X);
  if (Y == (N_Vector)0x0) {
    N_VDestroy(lVar56);
    N_VDestroy(X);
    puts("FAIL: Unable to create a new vector\n");
    Test_Abort(1);
  }
  lVar55 = lVar55 + lVar54;
  Z = (N_Vector)N_VClone(X);
  if (Z == (N_Vector)0x0) {
    N_VDestroy(lVar56);
    N_VDestroy(X);
    N_VDestroy(Y);
    puts("FAIL: Unable to create a new vector\n");
    Test_Abort(1);
  }
  puts("\nTesting standard vector operations:\n");
  iVar1 = Test_N_VConst(X,lVar55,0);
  iVar2 = Test_N_VLinearSum(X,Y,Z,lVar55,0);
  iVar4 = Test_N_VProd(X,Y,Z,lVar55,0);
  iVar5 = Test_N_VDiv(X,Y,Z,lVar55,0);
  iVar6 = Test_N_VScale(X,Z,lVar55,0);
  iVar7 = Test_N_VAbs(X,Z,lVar55,0);
  iVar8 = Test_N_VInv(X,Z,lVar55,0);
  iVar9 = Test_N_VAddConst(X,Z,lVar55,0);
  iVar10 = Test_N_VDotProd(X,Y,lVar55,0);
  iVar11 = Test_N_VMaxNorm(X,lVar55,0);
  iVar12 = Test_N_VWrmsNorm(X,Y,lVar55,0);
  iVar13 = Test_N_VWrmsNormMask(X,Y,Z,lVar55,0);
  iVar14 = Test_N_VMin(X,lVar55,0);
  iVar15 = Test_N_VWL2Norm(X,Y,lVar55,0);
  iVar16 = Test_N_VL1Norm(X,lVar55,0);
  iVar17 = Test_N_VCompare(X,Z,lVar55,0);
  iVar18 = Test_N_VInvTest(X,Z,lVar55,0);
  iVar19 = Test_N_VConstrMask(X,Y,Z,lVar55,0);
  iVar20 = Test_N_VMinQuotient(X,Y,lVar55,0);
  puts("\nTesting fused and vector array operations (disabled):\n");
  X_00 = (N_Vector)N_VClone(X);
  iVar21 = N_VEnableFusedOps_ManyVector(X_00,0);
  if ((X_00 == (N_Vector)0x0) || (iVar21 != 0)) {
    N_VDestroy(lVar56);
    N_VDestroy(X);
    N_VDestroy(Y);
    N_VDestroy(Z);
    puts("FAIL: Unable to create a new vector \n");
    Test_Abort(1);
  }
  iVar21 = Test_N_VLinearCombination(X_00,lVar55,0);
  iVar22 = Test_N_VScaleAddMulti(X_00,lVar55,0);
  iVar23 = Test_N_VDotProdMulti(X_00,lVar55,0);
  iVar24 = Test_N_VLinearSumVectorArray(X_00,lVar55,0);
  iVar25 = Test_N_VScaleVectorArray(X_00,lVar55,0);
  iVar26 = Test_N_VConstVectorArray(X_00,lVar55,0);
  iVar27 = Test_N_VWrmsNormVectorArray(X_00,lVar55,0);
  iVar28 = Test_N_VWrmsNormMaskVectorArray(X_00,lVar55,0);
  iVar29 = Test_N_VScaleAddMultiVectorArray(X_00,lVar55,0);
  iVar30 = Test_N_VLinearCombinationVectorArray(X_00,lVar55,0);
  puts("\nTesting fused and vector array operations (enabled):\n");
  p_Var58 = (N_Vector)N_VClone(X);
  iVar31 = N_VEnableFusedOps_ManyVector(p_Var58,1);
  if ((p_Var58 == (N_Vector)0x0) || (iVar31 != 0)) {
    N_VDestroy(lVar56);
    N_VDestroy(X);
    N_VDestroy(Y);
    N_VDestroy(Z);
    N_VDestroy(X_00);
    puts("FAIL: Unable to create a new vector \n");
    Test_Abort(1);
  }
  iVar31 = Test_N_VLinearCombination(p_Var58,lVar55,0);
  iVar32 = Test_N_VScaleAddMulti(p_Var58,lVar55,0);
  iVar33 = Test_N_VDotProdMulti(p_Var58,lVar55,0);
  iVar34 = Test_N_VLinearSumVectorArray(p_Var58,lVar55,0);
  iVar35 = Test_N_VScaleVectorArray(p_Var58,lVar55,0);
  iVar36 = Test_N_VConstVectorArray(p_Var58,lVar55,0);
  iVar37 = Test_N_VWrmsNormVectorArray(p_Var58,lVar55,0);
  iVar38 = Test_N_VWrmsNormMaskVectorArray(p_Var58,lVar55,0);
  iVar39 = Test_N_VScaleAddMultiVectorArray(p_Var58,lVar55,0);
  iVar40 = Test_N_VLinearCombinationVectorArray(p_Var58,lVar55,0);
  puts("\nTesting local reduction operations:\n");
  local_38 = p_Var58;
  iVar41 = Test_N_VDotProdLocal(X,Y,lVar55,0);
  iVar42 = Test_N_VMaxNormLocal(X,lVar55,0);
  iVar43 = Test_N_VMinLocal(X,lVar55,0);
  iVar44 = Test_N_VL1NormLocal(X,lVar55,0);
  iVar45 = Test_N_VWSqrSumLocal(X,Y,lVar55,0);
  iVar46 = Test_N_VWSqrSumMaskLocal(X,Y,Z,lVar55,0);
  iVar47 = Test_N_VInvTestLocal(X,Z,lVar55,0);
  iVar48 = Test_N_VConstrMaskLocal(X,Y,Z,lVar55,0);
  iVar49 = Test_N_VMinQuotientLocal(X,Y,lVar55,0);
  puts("\nTesting local fused reduction operations:\n");
  p_Var58 = local_38;
  iVar50 = Test_N_VDotProdMultiLocal(local_38,lVar55,0);
  puts("\nTesting XBraid interface operations:\n");
  iVar51 = Test_N_VBufSize(X,lVar55,0);
  iVar52 = Test_N_VBufPack(X,lVar55,0);
  iVar53 = Test_N_VBufUnpack(X,lVar55,0);
  N_VDestroy(lVar56);
  N_VDestroy(X);
  N_VDestroy(Y);
  N_VDestroy(Z);
  N_VDestroy(X_00);
  N_VDestroy(p_Var58);
  N_VDestroy(local_48);
  N_VDestroy(local_40);
  uVar59 = iVar53 + iVar52 + iVar51 + iVar50 +
                    iVar49 + iVar48 + iVar47 + iVar46 + iVar45 + iVar44 + iVar43 + iVar42 + iVar41 +
                                                                                            iVar40 +
                    iVar30 + iVar29 + iVar28 +
                    iVar20 + iVar19 + iVar18 + iVar17 + iVar16 +
                    iVar15 + iVar14 + iVar13 + iVar12 + iVar11 +
                    iVar10 + iVar9 + iVar8 + iVar7 + iVar6 + iVar5 + iVar4 + iVar2 + iVar1 + iVar3 +
                    iVar27 + iVar26 + iVar25 + iVar24 + iVar23 + iVar22 + iVar21 +
                    iVar39 + iVar38 + iVar37 + iVar36 + iVar35 + iVar34 + iVar33 + iVar32 + iVar31;
  if (uVar59 == 0) {
    puts("SUCCESS: NVector module passed all tests \n");
  }
  else {
    printf("FAIL: NVector module failed %i tests \n\n",(ulong)uVar59);
  }
  Test_Finalize();
  return uVar59;
}

Assistant:

int main(int argc, char* argv[])
{
  int fails = 0;             /* counter for test failures */
  int retval;                /* function return value     */
  sunindextype len1, len2;   /* vector lengths            */
  sunindextype length;       /* overall vector length     */
  N_Vector Xsub[2];          /* subvector pointer array   */
  N_Vector U, V, W, X, Y, Z; /* test vectors              */
  int print_timing;          /* turn timing on/off        */

  Test_Init(SUN_COMM_NULL);

  /* check input and set vector length */
  if (argc < 4)
  {
    printf("ERROR: THREE (3) Inputs required: subvector 1 length, subvector 2 "
           "length, print timing \n");
    Test_Abort(1);
  }

  len1 = (sunindextype)atol(argv[1]);
  if (len1 <= 0)
  {
    printf("ERROR: length of subvector 1 must be a positive integer \n");
    Test_Abort(1);
  }

  len2 = (sunindextype)atol(argv[2]);
  if (len2 <= 0)
  {
    printf("ERROR: length of subvector 2 must be a positive integer \n");
    Test_Abort(1);
  }

  print_timing = atoi(argv[3]);
  SetTiming(print_timing, 0);

  /* overall length */
  length = len1 + len2;

  printf("Testing ManyVector (serial) N_Vector \n");
  printf("Vector lengths: %ld %ld \n", (long int)len1, (long int)len2);

  /* Create subvectors */
  Xsub[0] = N_VNew_Serial(len1, sunctx);
  if (Xsub[0] == NULL)
  {
    printf("FAIL: Unable to create a new serial subvector \n\n");
    Test_Abort(1);
  }
  Xsub[1] = N_VNew_Serial(len2, sunctx);
  if (Xsub[1] == NULL)
  {
    N_VDestroy(Xsub[0]);
    printf("FAIL: Unable to create a new serial subvector \n\n");
    Test_Abort(1);
  }

  /* Create a new ManyVector */
  X = N_VNew_ManyVector(2, Xsub, sunctx);

  /* Check vector ID */
  fails += Test_N_VGetVectorID(X, SUNDIALS_NVEC_MANYVECTOR, 0);

  /* Check vector length */
  fails += Test_N_VGetLength(X, 0);

  /* Check vector communicator */
  fails += Test_N_VGetCommunicator(X, SUN_COMM_NULL, 0);

  /* Test subvector accessors */
  if (N_VGetNumSubvectors_ManyVector(X) != 2)
  {
    printf(">>> FAILED test -- N_VGetNumSubvectors_ManyVector\n");
    fails += 1;
  }
  U = N_VGetSubvector_ManyVector(X, 0);
  if (N_VGetLength(U) != len1)
  {
    printf(">>> FAILED test -- N_VGetSubvector_ManyVector\n");
    fails += 1;
  }
  U = N_VGetSubvector_ManyVector(X, 1);
  if (N_VGetLength(U) != len2)
  {
    printf(">>> FAILED test -- N_VGetSubvector_ManyVector\n");
    fails += 1;
  }

  /* Clone additional vectors for testing */
  W = N_VClone(X);
  if (W == NULL)
  {
    N_VDestroy(X);
    printf("FAIL: Unable to create a new vector\n\n");
    Test_Abort(1);
  }

  Y = N_VClone(X);
  if (Y == NULL)
  {
    N_VDestroy(W);
    N_VDestroy(X);
    printf("FAIL: Unable to create a new vector\n\n");
    Test_Abort(1);
  }

  Z = N_VClone(X);
  if (Z == NULL)
  {
    N_VDestroy(W);
    N_VDestroy(X);
    N_VDestroy(Y);
    printf("FAIL: Unable to create a new vector\n\n");
    Test_Abort(1);
  }

  /* Standard vector operation tests */
  printf("\nTesting standard vector operations:\n\n");

  fails += Test_N_VConst(X, length, 0);
  fails += Test_N_VLinearSum(X, Y, Z, length, 0);
  fails += Test_N_VProd(X, Y, Z, length, 0);
  fails += Test_N_VDiv(X, Y, Z, length, 0);
  fails += Test_N_VScale(X, Z, length, 0);
  fails += Test_N_VAbs(X, Z, length, 0);
  fails += Test_N_VInv(X, Z, length, 0);
  fails += Test_N_VAddConst(X, Z, length, 0);
  fails += Test_N_VDotProd(X, Y, length, 0);
  fails += Test_N_VMaxNorm(X, length, 0);
  fails += Test_N_VWrmsNorm(X, Y, length, 0);
  fails += Test_N_VWrmsNormMask(X, Y, Z, length, 0);
  fails += Test_N_VMin(X, length, 0);
  fails += Test_N_VWL2Norm(X, Y, length, 0);
  fails += Test_N_VL1Norm(X, length, 0);
  fails += Test_N_VCompare(X, Z, length, 0);
  fails += Test_N_VInvTest(X, Z, length, 0);
  fails += Test_N_VConstrMask(X, Y, Z, length, 0);
  fails += Test_N_VMinQuotient(X, Y, length, 0);

  /* Fused and vector array operations tests (disabled) */
  printf("\nTesting fused and vector array operations (disabled):\n\n");

  /* create vector and disable all fused and vector array operations */
  U      = N_VClone(X);
  retval = N_VEnableFusedOps_ManyVector(U, SUNFALSE);
  if (U == NULL || retval != 0)
  {
    N_VDestroy(W);
    N_VDestroy(X);
    N_VDestroy(Y);
    N_VDestroy(Z);
    printf("FAIL: Unable to create a new vector \n\n");
    Test_Abort(1);
  }

  /* fused operations */
  fails += Test_N_VLinearCombination(U, length, 0);
  fails += Test_N_VScaleAddMulti(U, length, 0);
  fails += Test_N_VDotProdMulti(U, length, 0);

  /* vector array operations */
  fails += Test_N_VLinearSumVectorArray(U, length, 0);
  fails += Test_N_VScaleVectorArray(U, length, 0);
  fails += Test_N_VConstVectorArray(U, length, 0);
  fails += Test_N_VWrmsNormVectorArray(U, length, 0);
  fails += Test_N_VWrmsNormMaskVectorArray(U, length, 0);
  fails += Test_N_VScaleAddMultiVectorArray(U, length, 0);
  fails += Test_N_VLinearCombinationVectorArray(U, length, 0);

  /* Fused and vector array operations tests (enabled) */
  printf("\nTesting fused and vector array operations (enabled):\n\n");

  /* create vector and enable all fused and vector array operations */
  V      = N_VClone(X);
  retval = N_VEnableFusedOps_ManyVector(V, SUNTRUE);
  if (V == NULL || retval != 0)
  {
    N_VDestroy(W);
    N_VDestroy(X);
    N_VDestroy(Y);
    N_VDestroy(Z);
    N_VDestroy(U);
    printf("FAIL: Unable to create a new vector \n\n");
    Test_Abort(1);
  }

  /* fused operations */
  fails += Test_N_VLinearCombination(V, length, 0);
  fails += Test_N_VScaleAddMulti(V, length, 0);
  fails += Test_N_VDotProdMulti(V, length, 0);

  /* vector array operations */
  fails += Test_N_VLinearSumVectorArray(V, length, 0);
  fails += Test_N_VScaleVectorArray(V, length, 0);
  fails += Test_N_VConstVectorArray(V, length, 0);
  fails += Test_N_VWrmsNormVectorArray(V, length, 0);
  fails += Test_N_VWrmsNormMaskVectorArray(V, length, 0);
  fails += Test_N_VScaleAddMultiVectorArray(V, length, 0);
  fails += Test_N_VLinearCombinationVectorArray(V, length, 0);

  /* local reduction operations */
  printf("\nTesting local reduction operations:\n\n");

  fails += Test_N_VDotProdLocal(X, Y, length, 0);
  fails += Test_N_VMaxNormLocal(X, length, 0);
  fails += Test_N_VMinLocal(X, length, 0);
  fails += Test_N_VL1NormLocal(X, length, 0);
  fails += Test_N_VWSqrSumLocal(X, Y, length, 0);
  fails += Test_N_VWSqrSumMaskLocal(X, Y, Z, length, 0);
  fails += Test_N_VInvTestLocal(X, Z, length, 0);
  fails += Test_N_VConstrMaskLocal(X, Y, Z, length, 0);
  fails += Test_N_VMinQuotientLocal(X, Y, length, 0);

  /* local fused reduction operations */
  printf("\nTesting local fused reduction operations:\n\n");
  fails += Test_N_VDotProdMultiLocal(V, length, 0);

  /* XBraid interface operations */
  printf("\nTesting XBraid interface operations:\n\n");

  fails += Test_N_VBufSize(X, length, 0);
  fails += Test_N_VBufPack(X, length, 0);
  fails += Test_N_VBufUnpack(X, length, 0);

  /* Free vectors */
  N_VDestroy(W);
  N_VDestroy(X);
  N_VDestroy(Y);
  N_VDestroy(Z);
  N_VDestroy(U);
  N_VDestroy(V);
  N_VDestroy(Xsub[0]);
  N_VDestroy(Xsub[1]);

  /* Print result */
  if (fails) { printf("FAIL: NVector module failed %i tests \n\n", fails); }
  else { printf("SUCCESS: NVector module passed all tests \n\n"); }

  Test_Finalize();
  return (fails);
}